

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COMVel.cpp
# Opt level: O0

void __thiscall OpenMD::COMVel::doFrame(COMVel *this,int param_2)

{
  bool bVar1;
  StuntDouble *in_RDI;
  RealType mass;
  Vector3d comVel;
  RealType mtot;
  int i;
  StuntDouble *sd;
  RealType *in_stack_ffffffffffffff48;
  Vector<double,_3U> *in_stack_ffffffffffffff50;
  SelectionManager *in_stack_ffffffffffffff60;
  SelectionEvaluator *in_stack_ffffffffffffff88;
  Vector<double,_3U> local_38;
  StuntDouble *local_18;
  
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)&in_RDI[2].localIndex_);
  if (bVar1) {
    in_stack_ffffffffffffff48 = &in_RDI->mass_;
    in_stack_ffffffffffffff50 = &local_38;
    SelectionEvaluator::evaluate(in_stack_ffffffffffffff88);
    SelectionManager::setSelectionSet(in_stack_ffffffffffffff60,(SelectionSet *)in_RDI);
    SelectionSet::~SelectionSet((SelectionSet *)0x1248bb);
  }
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_ffffffffffffff50,
             (Vector3<double> *)in_stack_ffffffffffffff48);
  local_18 = SelectionManager::beginSelected(in_stack_ffffffffffffff60,(int *)in_RDI);
  while (local_18 != (StuntDouble *)0x0) {
    StuntDouble::getMass(local_18);
    StuntDouble::getVel(in_RDI);
    OpenMD::operator*((Vector<double,_3U> *)in_RDI,(double)in_stack_ffffffffffffff50);
    Vector<double,_3U>::operator+=
              (in_stack_ffffffffffffff50,(Vector<double,_3U> *)in_stack_ffffffffffffff48);
    local_18 = SelectionManager::nextSelected(in_stack_ffffffffffffff60,(int *)in_RDI);
  }
  Vector<double,_3U>::operator/=(in_stack_ffffffffffffff50,(double)in_stack_ffffffffffffff48);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             in_stack_ffffffffffffff60,(value_type *)in_RDI);
  return;
}

Assistant:

void COMVel::doFrame(int) {
    StuntDouble* sd;
    int i;

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    RealType mtot = 0.0;
    Vector3d comVel(V3Zero);
    RealType mass;

    for (sd = seleMan1_.beginSelected(i); sd != NULL;
         sd = seleMan1_.nextSelected(i)) {
      mass = sd->getMass();
      mtot += mass;
      comVel += sd->getVel() * mass;
    }

    comVel /= mtot;

    values_.push_back(comVel);
  }